

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

zlib_table * zlib_mktable(uchar *lengths,int nlengths)

{
  zlib_table *pzVar1;
  int local_544;
  int local_528;
  int local_524;
  int j;
  int i;
  int maxlen;
  int code;
  int codes [288];
  int startcode [16];
  int count [16];
  int nlengths_local;
  uchar *lengths_local;
  
  j = 0;
  for (local_524 = 1; local_524 < 0x10; local_524 = local_524 + 1) {
    startcode[(long)local_524 + 0xe] = 0;
  }
  for (local_524 = 0; local_524 < nlengths; local_524 = local_524 + 1) {
    startcode[(ulong)lengths[local_524] + 0xe] = startcode[(ulong)lengths[local_524] + 0xe] + 1;
    if ((uint)j < (uint)lengths[local_524]) {
      j = (int)lengths[local_524];
    }
  }
  i = 0;
  for (local_524 = 1; local_524 < 0x10; local_524 = local_524 + 1) {
    codes[(long)local_524 + 0x11e] = i;
    i = (startcode[(long)local_524 + 0xe] + i) * 2;
  }
  for (local_524 = 0; local_524 < nlengths; local_524 = local_524 + 1) {
    i = codes[(ulong)lengths[local_524] + 0x11e];
    codes[(ulong)lengths[local_524] + 0x11e] = i + 1;
    (&maxlen)[local_524] = 0;
    for (local_528 = 0; local_528 < (int)(uint)lengths[local_524]; local_528 = local_528 + 1) {
      (&maxlen)[local_524] = (&maxlen)[local_524] << 1 | i & 1U;
      i = i >> 1;
    }
  }
  if ((uint)j < 9) {
    local_544 = j;
  }
  else {
    local_544 = 9;
  }
  pzVar1 = zlib_mkonetab(&maxlen,lengths,nlengths,0,0,local_544);
  return pzVar1;
}

Assistant:

static struct zlib_table *zlib_mktable(unsigned char *lengths,
                                       int nlengths)
{
    int count[MAXCODELEN], startcode[MAXCODELEN], codes[MAXSYMS];
    int code, maxlen;
    int i, j;

    /* Count the codes of each length. */
    maxlen = 0;
    for (i = 1; i < MAXCODELEN; i++)
        count[i] = 0;
    for (i = 0; i < nlengths; i++) {
        count[lengths[i]]++;
        if (maxlen < lengths[i])
            maxlen = lengths[i];
    }
    /* Determine the starting code for each length block. */
    code = 0;
    for (i = 1; i < MAXCODELEN; i++) {
        startcode[i] = code;
        code += count[i];
        code <<= 1;
    }
    /* Determine the code for each symbol. Mirrored, of course. */
    for (i = 0; i < nlengths; i++) {
        code = startcode[lengths[i]]++;
        codes[i] = 0;
        for (j = 0; j < lengths[i]; j++) {
            codes[i] = (codes[i] << 1) | (code & 1);
            code >>= 1;
        }
    }

    /*
     * Now we have the complete list of Huffman codes. Build a
     * table.
     */
    return zlib_mkonetab(codes, lengths, nlengths, 0, 0,
                         maxlen < 9 ? maxlen : 9);
}